

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

void __thiscall
leveldb::InternalKeyComparator::FindShortestSeparator
          (InternalKeyComparator *this,string *start,Slice *limit)

{
  int iVar1;
  string tmp;
  Slice user_start;
  Slice user_limit;
  string local_90;
  pointer local_70;
  ulong local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type sStack_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  long local_38;
  
  if (7 < start->_M_string_length) {
    local_70 = (start->_M_dataplus)._M_p;
    local_68 = start->_M_string_length - 8;
    if (7 < limit->size_) {
      local_40 = limit->data_;
      local_38 = limit->size_ - 8;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,local_70,local_70 + local_68);
      (*this->user_comparator_->_vptr_Comparator[4])(this->user_comparator_,&local_90,&local_40);
      if (CONCAT44(local_90._M_string_length._4_4_,(undefined4)local_90._M_string_length) < local_68
         ) {
        local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_90._M_dataplus._M_p;
        iVar1 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&local_70);
        if (iVar1 < 0) {
          PutFixed64(&local_90,0xffffffffffffff01);
          local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(start->_M_dataplus)._M_p;
          sStack_58 = start->_M_string_length;
          local_50 = local_90._M_dataplus._M_p._0_4_;
          uStack_4c = local_90._M_dataplus._M_p._4_4_;
          uStack_48 = (undefined4)local_90._M_string_length;
          uStack_44 = local_90._M_string_length._4_4_;
          iVar1 = (*(this->super_Comparator)._vptr_Comparator[2])(this);
          if (-1 < iVar1) {
            __assert_fail("this->Compare(*start, tmp) < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/dbformat.cc"
                          ,0x51,
                          "virtual void leveldb::InternalKeyComparator::FindShortestSeparator(std::string *, const Slice &) const"
                         );
          }
          local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_90._M_dataplus._M_p;
          iVar1 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_60,limit);
          if (-1 < iVar1) {
            __assert_fail("this->Compare(tmp, limit) < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/dbformat.cc"
                          ,0x52,
                          "virtual void leveldb::InternalKeyComparator::FindShortestSeparator(std::string *, const Slice &) const"
                         );
          }
          std::__cxx11::string::swap((string *)start);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      return;
    }
  }
  __assert_fail("internal_key.size() >= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/dbformat.h"
                ,100,"Slice leveldb::ExtractUserKey(const Slice &)");
}

Assistant:

void InternalKeyComparator::FindShortestSeparator(
            std::string *start,
            const Slice &limit) const {
        // Attempt to shorten the user portion of the key
        Slice user_start = ExtractUserKey(*start);
        Slice user_limit = ExtractUserKey(limit);
        std::string tmp(user_start.data(), user_start.size());
        user_comparator_->FindShortestSeparator(&tmp, user_limit);
        if (tmp.size() < user_start.size() &&
            user_comparator_->Compare(user_start, tmp) < 0) {
            // User key has become shorter physically, but larger logically.
            // Tack on the earliest possible number to the shortened user key.
            PutFixed64(&tmp, PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
            assert(this->Compare(*start, tmp) < 0);
            assert(this->Compare(tmp, limit) < 0);
            start->swap(tmp);
        }
    }